

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O0

void Diligent::ValidateCopyTextureParams(CopyTextureAttribs *CopyAttribs)

{
  Uint32 UVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  Char *Message;
  TextureDesc *TexDesc;
  TextureDesc *TexDesc_00;
  char (*in_RCX) [73];
  undefined1 local_b8 [8];
  Box DstBox;
  MipLevelProperties MipLevelAttribs;
  Box *pSrcBox;
  TextureDesc *DstTexDesc;
  TextureDesc *SrcTexDesc;
  Uint32 local_50;
  Box SrcBox;
  undefined1 local_30 [8];
  string msg;
  CopyTextureAttribs *CopyAttribs_local;
  
  msg.field_2._8_8_ = CopyAttribs;
  if ((CopyAttribs->pSrcTexture == (ITexture *)0x0) || (CopyAttribs->pDstTexture == (ITexture *)0x0)
     ) {
    FormatString<char[26],char[73]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CopyAttribs.pSrcTexture != nullptr && CopyAttribs.pDstTexture != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValidateCopyTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1b2);
    std::__cxx11::string::~string((string *)local_30);
  }
  Box::Box((Box *)((long)&SrcTexDesc + 4));
  TexDesc = (TextureDesc *)(**(code **)(**(long **)msg.field_2._8_8_ + 0x20))();
  TexDesc_00 = (TextureDesc *)(**(code **)(**(long **)(msg.field_2._8_8_ + 0x20) + 0x20))();
  MipLevelAttribs.MipSize = *(Uint64 *)(msg.field_2._8_8_ + 0x10);
  if (MipLevelAttribs.MipSize == 0) {
    GetMipLevelProperties
              ((MipLevelProperties *)&DstBox.MinZ,TexDesc,*(Uint32 *)(msg.field_2._8_8_ + 8));
    local_50 = DstBox.MinZ;
    SrcBox.MaxX = DstBox.MaxZ;
    MipLevelAttribs.MipSize = (long)&SrcTexDesc + 4;
  }
  ValidateTextureRegion
            (TexDesc,*(Uint32 *)(msg.field_2._8_8_ + 8),*(Uint32 *)(msg.field_2._8_8_ + 0xc),
             (Box *)MipLevelAttribs.MipSize);
  Box::Box((Box *)local_b8);
  UVar1 = *(Uint32 *)(msg.field_2._8_8_ + 0x30);
  DstBox.MinX = *(Uint32 *)(msg.field_2._8_8_ + 0x34);
  DstBox.MinY = *(Uint32 *)(msg.field_2._8_8_ + 0x38);
  local_b8._0_4_ = UVar1;
  local_b8._4_4_ = Box::Width((Box *)MipLevelAttribs.MipSize);
  UVar3 = DstBox.MinX;
  local_b8._4_4_ = UVar1 + local_b8._4_4_;
  UVar2 = Box::Height((Box *)MipLevelAttribs.MipSize);
  UVar1 = DstBox.MinY;
  DstBox.MaxX = UVar3 + UVar2;
  UVar3 = Box::Depth((Box *)MipLevelAttribs.MipSize);
  DstBox.MaxY = UVar1 + UVar3;
  ValidateTextureRegion
            (TexDesc_00,*(Uint32 *)(msg.field_2._8_8_ + 0x28),*(Uint32 *)(msg.field_2._8_8_ + 0x2c),
             (Box *)local_b8);
  return;
}

Assistant:

void ValidateCopyTextureParams(const CopyTextureAttribs& CopyAttribs)
{
    VERIFY_EXPR(CopyAttribs.pSrcTexture != nullptr && CopyAttribs.pDstTexture != nullptr);
    Box                SrcBox;
    const TextureDesc& SrcTexDesc = CopyAttribs.pSrcTexture->GetDesc();
    const TextureDesc& DstTexDesc = CopyAttribs.pDstTexture->GetDesc();
    const Box*         pSrcBox    = CopyAttribs.pSrcBox;
    if (pSrcBox == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        SrcBox.MaxX = MipLevelAttribs.LogicalWidth;
        SrcBox.MaxY = MipLevelAttribs.LogicalHeight;
        SrcBox.MaxZ = MipLevelAttribs.Depth;
        pSrcBox     = &SrcBox;
    }
    ValidateTextureRegion(SrcTexDesc, CopyAttribs.SrcMipLevel, CopyAttribs.SrcSlice, *pSrcBox);

    Box DstBox;
    DstBox.MinX = CopyAttribs.DstX;
    DstBox.MinY = CopyAttribs.DstY;
    DstBox.MinZ = CopyAttribs.DstZ;
    DstBox.MaxX = DstBox.MinX + pSrcBox->Width();
    DstBox.MaxY = DstBox.MinY + pSrcBox->Height();
    DstBox.MaxZ = DstBox.MinZ + pSrcBox->Depth();
    ValidateTextureRegion(DstTexDesc, CopyAttribs.DstMipLevel, CopyAttribs.DstSlice, DstBox);
}